

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimp3_ex.h
# Opt level: O0

int mp3dec_detect_cb(mp3dec_io_t *io,uint8_t *buf,size_t buf_size)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  size_t *in_RDX;
  long in_RSI;
  int *in_RDI;
  int frame_size;
  int free_format_bytes;
  size_t readed;
  size_t filled;
  int local_38;
  size_t in_stack_ffffffffffffffd0;
  size_t *buf_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (((in_RSI == 0) || (in_RDX == (size_t *)0xffffffffffffffff)) ||
     ((in_RDI != (int *)0x0 && (in_RDX < (size_t *)0x4000)))) {
    return -1;
  }
  buf_00 = in_RDX;
  if (in_RDI != (int *)0x0) {
    iVar1 = (**(code **)(in_RDI + 4))(0,*(undefined8 *)(in_RDI + 6));
    if (iVar1 != 0) {
      return -3;
    }
    buf_00 = in_RDX;
    in_RDX = (size_t *)(**(code **)in_RDI)(in_RSI,10,*(undefined8 *)(in_RDI + 2));
    if ((size_t *)0xa < in_RDX) {
      return -3;
    }
  }
  if (in_RDX < (size_t *)0xa) {
    iVar1 = -4;
  }
  else {
    sVar2 = mp3dec_skip_id3v2((uint8_t *)in_RDX,in_stack_ffffffffffffffd0);
    if (sVar2 == 0) {
      if (in_RDI == (int *)0x0) {
        mp3dec_skip_id3v1((uint8_t *)buf_00,in_RDX);
      }
      else {
        uVar3 = (**(code **)in_RDI)(in_RSI + 10,(long)buf_00 + -10,*(undefined8 *)(in_RDI + 2));
        if ((long)buf_00 - 10U < uVar3) {
          return -3;
        }
        if ((size_t *)(uVar3 + (long)in_RDX) < (size_t *)0x4000) {
          mp3dec_skip_id3v1((uint8_t *)buf_00,(size_t *)(uVar3 + (long)in_RDX));
        }
      }
      mp3d_find_frame((uint8_t *)readed,free_format_bytes,
                      (int *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
      if (local_38 == 0) {
        iVar1 = -4;
      }
      else {
        iVar1 = 0;
      }
    }
    else {
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int mp3dec_detect_cb(mp3dec_io_t *io, uint8_t *buf, size_t buf_size)
{
    if (!buf || (size_t)-1 == buf_size || (io && buf_size < MINIMP3_BUF_SIZE))
        return MP3D_E_PARAM;
    size_t filled = buf_size;
    if (io)
    {
        if (io->seek(0, io->seek_data))
            return MP3D_E_IOERROR;
        filled = io->read(buf, MINIMP3_ID3_DETECT_SIZE, io->read_data);
        if (filled > MINIMP3_ID3_DETECT_SIZE)
            return MP3D_E_IOERROR;
    }
    if (filled < MINIMP3_ID3_DETECT_SIZE)
        return MP3D_E_USER; /* too small, can't be mp3/mpa */
    if (mp3dec_skip_id3v2(buf, filled))
        return 0; /* id3v2 tag is enough evidence */
    if (io)
    {
        size_t readed = io->read(buf + MINIMP3_ID3_DETECT_SIZE, buf_size - MINIMP3_ID3_DETECT_SIZE, io->read_data);
        if (readed > (buf_size - MINIMP3_ID3_DETECT_SIZE))
            return MP3D_E_IOERROR;
        filled += readed;
        if (filled < MINIMP3_BUF_SIZE)
            mp3dec_skip_id3v1(buf, &filled);
    } else
    {
        mp3dec_skip_id3v1(buf, &filled);
        if (filled > MINIMP3_BUF_SIZE)
            filled = MINIMP3_BUF_SIZE;
    }
    int free_format_bytes, frame_size;
    mp3d_find_frame(buf, filled, &free_format_bytes, &frame_size);
    if (frame_size)
        return 0; /* MAX_FRAME_SYNC_MATCHES consecutive frames found */
    return MP3D_E_USER;
}